

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbePmaReadBlob(PmaReader *p,int nByte,u8 **ppOut)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  u64 uVar5;
  u64 nBytes;
  u8 *__dest;
  long lVar6;
  long lVar7;
  int iVar8;
  u8 *aNext;
  u8 *local_38;
  
  lVar2 = p->iReadOff;
  if (p->aMap == (u8 *)0x0) {
    iVar8 = p->nBuffer;
    lVar7 = lVar2 % (long)iVar8;
    if (lVar7 == 0) {
      lVar6 = p->iEof - lVar2;
      if (lVar6 <= iVar8) {
        iVar8 = (int)lVar6;
      }
      iVar8 = (*p->pFd->pMethods->xRead)(p->pFd,p->aBuffer,iVar8,lVar2);
      if (iVar8 != 0) {
        return iVar8;
      }
      iVar8 = p->nBuffer;
    }
    iVar8 = iVar8 - (int)lVar7;
    if (iVar8 < nByte) {
      iVar1 = p->nAlloc;
      if (iVar1 < nByte) {
        uVar5 = 0x80;
        if (0x3f < iVar1) {
          uVar5 = (long)iVar1 * 2;
        }
        do {
          nBytes = uVar5;
          uVar5 = nBytes * 2;
        } while ((long)nBytes < (long)nByte);
        __dest = (u8 *)sqlite3Realloc(p->aAlloc,nBytes);
        if (__dest == (u8 *)0x0) {
          return 7;
        }
        p->nAlloc = (int)nBytes;
        p->aAlloc = __dest;
      }
      else {
        __dest = p->aAlloc;
      }
      memcpy(__dest,p->aBuffer + lVar7,(long)iVar8);
      p->iReadOff = p->iReadOff + (long)iVar8;
      if (nByte - iVar8 != 0 && iVar8 <= nByte) {
        iVar8 = nByte - iVar8;
        do {
          iVar1 = p->nBuffer;
          if (iVar8 < p->nBuffer) {
            iVar1 = iVar8;
          }
          iVar4 = vdbePmaReadBlob(p,iVar1,&local_38);
          if (iVar4 != 0) {
            return iVar4;
          }
          memcpy(p->aAlloc + (nByte - iVar8),local_38,(long)iVar1);
          iVar4 = iVar8 - iVar1;
          bVar3 = iVar1 <= iVar8;
          iVar8 = iVar4;
        } while (iVar4 != 0 && bVar3);
      }
      *ppOut = p->aAlloc;
    }
    else {
      *ppOut = p->aBuffer + lVar7;
      p->iReadOff = p->iReadOff + (long)nByte;
    }
  }
  else {
    *ppOut = p->aMap + lVar2;
    p->iReadOff = nByte + lVar2;
  }
  return 0;
}

Assistant:

static int vdbePmaReadBlob(
  PmaReader *p,                   /* PmaReader from which to take the blob */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */

  if( p->aMap ){
    *ppOut = &p->aMap[p->iReadOff];
    p->iReadOff += nByte;
    return SQLITE_OK;
  }

  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next 
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Readr data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFd, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf; 

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a 
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      u8 *aNew;
      sqlite3_int64 nNew = MAX(128, 2*(sqlite3_int64)p->nAlloc);
      while( nByte>nNew ) nNew = nNew*2;
      aNew = sqlite3Realloc(p->aAlloc, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      p->nAlloc = nNew;
      p->aAlloc = aNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbePmaReadBlob() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbePmaReadBlob(p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}